

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SessionTestCase.cpp
# Opt level: O2

void __thiscall
SuiteSessionTests::disconnectBeforeStartTimeFixture::disconnectBeforeStartTimeFixture
          (disconnectBeforeStartTimeFixture *this)

{
  UtcTimeOnly *pUVar1;
  
  acceptorFixture::acceptorFixture(&this->super_acceptorFixture);
  (this->super_acceptorFixture).super_sessionFixture.super_TestCallback.super_Responder.
  _vptr_Responder = (_func_int **)&PTR__sessionFixture_00326058;
  (this->super_acceptorFixture).super_sessionFixture.super_TestCallback.super_NullApplication.
  super_Application._vptr_Application =
       (_func_int **)&PTR__disconnectBeforeStartTimeFixture_003260b0;
  pUVar1 = &(this->super_acceptorFixture).super_sessionFixture.super_TestCallback.startTime;
  FIX::UtcTimeOnly::setCurrent(pUVar1);
  FIX::DateTime::operator+=(&pUVar1->super_DateTime,100000000);
  pUVar1 = &(this->super_acceptorFixture).super_sessionFixture.super_TestCallback.endTime;
  FIX::UtcTimeOnly::setCurrent(pUVar1);
  FIX::DateTime::operator+=(&pUVar1->super_DateTime,400000000);
  sessionFixture::createSession((sessionFixture *)this,0,-1,-1);
  return;
}

Assistant:

disconnectBeforeStartTimeFixture()
  {
    startTime.setCurrent();
    startTime += 100000000;
    endTime.setCurrent();
    endTime += 400000000;

    acceptorFixture::createSession( 0 );
  }